

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

Function * __thiscall
wasm::anon_unknown_18::FunctionSplitter::getInlineableSplitFunction
          (FunctionSplitter *this,Function *func,InliningMode inliningMode)

{
  mapped_type *pmVar1;
  Function *pFVar2;
  mapped_type *split;
  InliningMode inliningMode_local;
  Function *func_local;
  FunctionSplitter *this_local;
  
  if (inliningMode != SplitPatternA && inliningMode != SplitPatternB) {
    __assert_fail("inliningMode == InliningMode::SplitPatternA || inliningMode == InliningMode::SplitPatternB"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x3c9,
                  "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *, InliningMode)"
                 );
  }
  pmVar1 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
           ::operator[](&this->splits,(key_type *)func);
  if (pmVar1->inlineable == (Function *)0x0) {
    pFVar2 = doSplit(this,func,inliningMode);
    pmVar1->inlineable = pFVar2;
  }
  return pmVar1->inlineable;
}

Assistant:

Function* getInlineableSplitFunction(Function* func,
                                       InliningMode inliningMode) {
    assert(inliningMode == InliningMode::SplitPatternA ||
           inliningMode == InliningMode::SplitPatternB);
    auto& split = splits[func->name];

    if (!split.inlineable) {
      // We haven't performed the split, do it now.
      split.inlineable = doSplit(func, inliningMode);
    }

    return split.inlineable;
  }